

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O3

void dmrC_copy_statement(dmr_C *C,statement *src,statement *dst)

{
  ptr_list **listp;
  undefined8 uVar1;
  statement *psVar2;
  symbol *psVar3;
  undefined1 local_50 [8];
  ptr_list_iter stmtiter__;
  
  stmtiter__._16_8_ = dst;
  ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(src->field_2).field_1.expression);
  psVar2 = (statement *)ptrlist_iter_next((ptr_list_iter *)local_50);
  if (psVar2 != (statement *)0x0) {
    listp = (ptr_list **)(stmtiter__._16_8_ + 0x10);
    do {
      psVar2 = copy_one_statement(C,psVar2);
      ptrlist_add(listp,psVar2,&C->ptrlist_allocator);
      psVar2 = (statement *)ptrlist_iter_next((ptr_list_iter *)local_50);
    } while (psVar2 != (statement *)0x0);
  }
  psVar2 = copy_one_statement(C,(src->field_2).field_4.args);
  uVar1 = stmtiter__._16_8_;
  *(statement **)(stmtiter__._16_8_ + 0x28) = psVar2;
  psVar3 = copy_symbol(C,src->pos,(src->field_2).field_2.ret_target);
  *(symbol **)(uVar1 + 0x18) = psVar3;
  *(statement **)(uVar1 + 0x20) = (src->field_2).field_3.if_false;
  return;
}

Assistant:

void dmrC_copy_statement(struct dmr_C *C, struct statement *src, struct statement *dst)
{
	struct statement *stmt;

	FOR_EACH_PTR(src->stmts, stmt) {
		dmrC_add_statement(C, &dst->stmts, copy_one_statement(C, stmt));
	} END_FOR_EACH_PTR(stmt);
	dst->args = copy_one_statement(C, src->args);
	dst->ret = copy_symbol(C, src->pos, src->ret);
	dst->inline_fn = src->inline_fn;
}